

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.hpp
# Opt level: O1

char * trial::protocol::json::detail::scan_narrow<char>(char *marker,char *tail)

{
  byte bVar1;
  uint uVar2;
  ushort uVar3;
  long lVar4;
  int *piVar5;
  byte *pbVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  lVar4 = (long)tail - (long)marker;
  do {
    if (lVar4 < 0x11) {
      if (marker == tail) {
        return (char *)(byte *)marker;
      }
      while( true ) {
        bVar1 = *marker;
        if ((long)(char)bVar1 < 0) {
          if (bVar1 < 0xc0) {
            return (char *)(byte *)marker;
          }
          piVar5 = (int *)(traits::to_category<char>(char)::upper +
                          (ulong)((int)(char)bVar1 & 0x3f) * 4);
        }
        else {
          piVar5 = (int *)(traits::to_category<char>(char)::lower + (long)(char)bVar1 * 4);
        }
        if (*piVar5 != 0) break;
        marker = (char *)((byte *)marker + 1);
        if (marker == tail) {
          return tail;
        }
      }
      return (char *)(byte *)marker;
    }
    auVar8[0] = -((char)(*marker ^ 2U) < '!');
    auVar8[1] = -((char)(((byte *)marker)[1] ^ 2) < '!');
    auVar8[2] = -((char)(((byte *)marker)[2] ^ 2) < '!');
    auVar8[3] = -((char)(((byte *)marker)[3] ^ 2) < '!');
    auVar8[4] = -((char)(((byte *)marker)[4] ^ 2) < '!');
    auVar8[5] = -((char)(((byte *)marker)[5] ^ 2) < '!');
    auVar8[6] = -((char)(((byte *)marker)[6] ^ 2) < '!');
    auVar8[7] = -((char)(((byte *)marker)[7] ^ 2) < '!');
    auVar8[8] = -((char)(((byte *)marker)[8] ^ 2) < '!');
    auVar8[9] = -((char)(((byte *)marker)[9] ^ 2) < '!');
    auVar8[10] = -((char)(((byte *)marker)[10] ^ 2) < '!');
    auVar8[0xb] = -((char)(((byte *)marker)[0xb] ^ 2) < '!');
    auVar8[0xc] = -((char)(((byte *)marker)[0xc] ^ 2) < '!');
    auVar8[0xd] = -((char)(((byte *)marker)[0xd] ^ 2) < '!');
    auVar8[0xe] = -((char)(((byte *)marker)[0xe] ^ 2) < '!');
    auVar8[0xf] = -((char)(((byte *)marker)[0xf] ^ 2) < '!');
    auVar7[0] = -(*marker == '\\');
    auVar7[1] = -(((byte *)marker)[1] == '\\');
    auVar7[2] = -(((byte *)marker)[2] == '\\');
    auVar7[3] = -(((byte *)marker)[3] == '\\');
    auVar7[4] = -(((byte *)marker)[4] == '\\');
    auVar7[5] = -(((byte *)marker)[5] == '\\');
    auVar7[6] = -(((byte *)marker)[6] == '\\');
    auVar7[7] = -(((byte *)marker)[7] == '\\');
    auVar7[8] = -(((byte *)marker)[8] == '\\');
    auVar7[9] = -(((byte *)marker)[9] == '\\');
    auVar7[10] = -(((byte *)marker)[10] == '\\');
    auVar7[0xb] = -(((byte *)marker)[0xb] == '\\');
    auVar7[0xc] = -(((byte *)marker)[0xc] == '\\');
    auVar7[0xd] = -(((byte *)marker)[0xd] == '\\');
    auVar7[0xe] = -(((byte *)marker)[0xe] == '\\');
    auVar7[0xf] = -(((byte *)marker)[0xf] == '\\');
    auVar7 = auVar7 | auVar8;
    uVar3 = (ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar7[0xf] >> 7) << 0xf;
    uVar2 = 0;
    if (uVar3 != 0) {
      for (; (uVar3 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    pbVar6 = (byte *)marker + uVar2;
    marker = (char *)((byte *)marker + 0x10);
    lVar4 = lVar4 + -0x10;
  } while (uVar3 == 0);
  return (char *)pbVar6;
}

Assistant:

auto scan_narrow(const CharT *marker,
                 const CharT * const tail) noexcept -> const CharT *
{
#if defined(TRIAL_PROTOCOL_USE_SSE2)
    // Swaps space and quote characters
    const auto permuter = _mm_set1_epi8(0x02);
    // Covers permuted quote and control characters + extra characters
    const auto lower = _mm_set1_epi8(0x21);
    const auto escape = _mm_set1_epi8(0x5e);
    while (tail - marker > 16)
    {
        const auto data = _mm_xor_si128(_mm_loadu_si128((const __m128i *)marker),
                                        permuter);
        const auto avoid = _mm_or_si128(_mm_cmpeq_epi8(data, escape),
                                        _mm_cmplt_epi8(data, lower));
        const auto mask = _mm_movemask_epi8(avoid);
        if (mask != 0)
            return marker + core::detail::countr_zero(mask);
        marker += 16;
    }
#endif

    while (marker != tail)
    {
        if (traits::to_category(*marker) == traits::category::narrow)
        {
            ++marker;
        }
        else
            break;
    }
    return marker;
}